

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::SSAPropagator::IsPhiArgExecutable(SSAPropagator *this,Instruction *phi,uint32_t i)

{
  IRContext *this_00;
  uint32_t id;
  BasicBlock *b2;
  Instruction *instr;
  BasicBlock *b1;
  const_iterator cVar1;
  Edge local_30;
  
  b2 = IRContext::get_instr_block(this->ctx_,phi);
  id = Instruction::GetSingleWordOperand(phi,i + 1);
  this_00 = this->ctx_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  instr = analysis::DefUseManager::GetDef
                    ((this_00->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,id);
  b1 = IRContext::get_instr_block(this->ctx_,instr);
  Edge::Edge(&local_30,b1,b2);
  cVar1 = std::
          _Rb_tree<spvtools::opt::Edge,_spvtools::opt::Edge,_std::_Identity<spvtools::opt::Edge>,_std::less<spvtools::opt::Edge>,_std::allocator<spvtools::opt::Edge>_>
          ::find(&(this->executable_edges_)._M_t,&local_30);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->executable_edges_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool SSAPropagator::IsPhiArgExecutable(Instruction* phi, uint32_t i) const {
  BasicBlock* phi_bb = ctx_->get_instr_block(phi);

  uint32_t in_label_id = phi->GetSingleWordOperand(i + 1);
  Instruction* in_label_instr = get_def_use_mgr()->GetDef(in_label_id);
  BasicBlock* in_bb = ctx_->get_instr_block(in_label_instr);

  return IsEdgeExecutable(Edge(in_bb, phi_bb));
}